

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  XmlWriter *this_00;
  pointer psVar1;
  XmlWriter *this_01;
  int iVar2;
  tm *__tp;
  undefined4 extraout_var;
  _anonymous_namespace_ *this_02;
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>
  *child;
  pointer psVar3;
  long in_FS_OFFSET;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  undefined1 local_e0 [24];
  ScopedElement properties;
  ScopedElement e;
  time_t rawtime;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_74 [12];
  string local_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_e0._16_8_ = suiteTime;
  std::__cxx11::string::string((string *)&local_48,"testsuite",(allocator *)&local_68);
  this_00 = &this->xml;
  XmlWriter::scopedElement((XmlWriter *)&e,(string *)this_00,(XmlFormatting)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"name",(allocator *)&local_68);
  XmlWriter::writeAttribute(this_00,&local_48,&(groupNode->value).groupInfo.name);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"errors",(allocator *)&local_68);
  XmlWriter::writeAttribute<unsigned_int>(this_00,&local_48,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"failures",(allocator *)local_88._M_local_buf);
  local_68._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed - (ulong)this->unexpectedExceptions);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_48,(unsigned_long *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"tests",(allocator *)local_88._M_local_buf);
  local_68._M_dataplus._M_p =
       (pointer)((groupNode->value).totals.assertions.failed +
                 (groupNode->value).totals.assertions.passed +
                (groupNode->value).totals.assertions.failedButOk);
  XmlWriter::writeAttribute<unsigned_long>(this_00,&local_48,(unsigned_long *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"hostname",(allocator *)&local_68);
  XmlWriter::writeAttribute<char[4]>(this_00,&local_48,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 2) {
    std::__cxx11::string::string((string *)&local_48,"time",(allocator *)&local_68);
    XmlWriter::writeAttribute<char[1]>(this_00,&local_48,(char (*) [1])0x1b71cf);
  }
  else {
    this_02 = (_anonymous_namespace_ *)0x1b4dcb;
    std::__cxx11::string::string((string *)&local_48,"time",(allocator *)local_88._M_local_buf);
    (anonymous_namespace)::formatDuration_abi_cxx11_(&local_68,this_02,(double)local_e0._16_8_);
    XmlWriter::writeAttribute(this_00,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"timestamp",(allocator *)&properties);
  time(&rawtime);
  __tp = gmtime(&rawtime);
  strftime(local_88._M_local_buf,0x15,"%Y-%m-%dT%H:%M:%SZ",__tp);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,&local_88,local_74);
  XmlWriter::writeAttribute(this_00,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 == '\0') {
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0x11])();
    if (iVar2 == 0) goto LAB_00187118;
  }
  std::__cxx11::string::string((string *)&local_48,"properties",(allocator *)&local_68);
  XmlWriter::scopedElement((XmlWriter *)&properties,(string *)this_00,(XmlFormatting)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0xe])();
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_48,"property",&local_e1);
    XmlWriter::scopedElement((XmlWriter *)local_e0,(string *)this_00,(XmlFormatting)&local_48);
    std::__cxx11::string::string((string *)&local_68,"name",&local_e2);
    this_01 = (XmlWriter *)CONCAT44(local_e0._4_4_,local_e0._0_4_);
    XmlWriter::writeAttribute<char[8]>(this_01,&local_68,(char (*) [8])"filters");
    std::__cxx11::string::string((string *)local_88._M_local_buf,"value",&local_e3);
    iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[0xf])();
    serializeFilters((string *)&rawtime,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    XmlWriter::writeAttribute(this_01,(string *)&local_88,(string *)&rawtime);
    std::__cxx11::string::~string((string *)&rawtime);
    std::__cxx11::string::~string((string *)local_88._M_local_buf);
    std::__cxx11::string::~string((string *)&local_68);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_e0);
    std::__cxx11::string::~string((string *)&local_48);
  }
  iVar2 = (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar2 != 0) {
    std::__cxx11::string::string((string *)&local_48,"property",&local_e1);
    XmlWriter::scopedElement((XmlWriter *)&rawtime,(string *)this_00,(XmlFormatting)&local_48);
    std::__cxx11::string::string((string *)&local_68,"name",&local_e2);
    XmlWriter::writeAttribute<char[12]>((XmlWriter *)rawtime,&local_68,(char (*) [12])"random-seed")
    ;
    std::__cxx11::string::string((string *)local_88._M_local_buf,"value",&local_e3);
    local_e0._0_4_ =
         (*(((this->super_CumulativeReporterBase<Catch::JunitReporter>).m_config.
             super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::writeAttribute<unsigned_int>
              ((XmlWriter *)rawtime,(string *)&local_88,(uint *)local_e0);
    std::__cxx11::string::~string((string *)local_88._M_local_buf);
    std::__cxx11::string::~string((string *)&local_68);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&rawtime);
    std::__cxx11::string::~string((string *)&local_48);
  }
  XmlWriter::ScopedElement::~ScopedElement(&properties);
LAB_00187118:
  psVar1 = (groupNode->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (groupNode->children).
                super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    writeTestCase(this,(psVar3->
                       super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr);
  }
  std::__cxx11::string::string((string *)&local_48,"system-out",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)&local_88,(string *)this_00,(XmlFormatting)&local_48);
  trim(&local_68,&this->stdOutForSuite);
  XmlWriter::writeText((XmlWriter *)local_88._M_allocated_capacity,&local_68,Newline);
  std::__cxx11::string::~string((string *)&local_68);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"system-err",(allocator *)&rawtime);
  XmlWriter::scopedElement((XmlWriter *)&local_88,(string *)this_00,(XmlFormatting)&local_48);
  trim(&local_68,&this->stdErrForSuite);
  XmlWriter::writeText((XmlWriter *)local_88._M_allocated_capacity,&local_68,Newline);
  std::__cxx11::string::~string((string *)&local_68);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  XmlWriter::ScopedElement::~ScopedElement(&e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void JunitReporter::writeGroup( TestGroupNode const& groupNode, double suiteTime ) {
        XmlWriter::ScopedElement e = xml.scopedElement( "testsuite" );

        TestGroupStats const& stats = groupNode.value;
        xml.writeAttribute( "name", stats.groupInfo.name );
        xml.writeAttribute( "errors", unexpectedExceptions );
        xml.writeAttribute( "failures", stats.totals.assertions.failed-unexpectedExceptions );
        xml.writeAttribute( "tests", stats.totals.assertions.total() );
        xml.writeAttribute( "hostname", "tbd" ); // !TBD
        if( m_config->showDurations() == ShowDurations::Never )
            xml.writeAttribute( "time", "" );
        else
            xml.writeAttribute( "time", formatDuration( suiteTime ) );
        xml.writeAttribute( "timestamp", getCurrentTimestamp() );

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for( auto const& child : groupNode.children )
            writeTestCase( *child );

        xml.scopedElement( "system-out" ).writeText( trim( stdOutForSuite ), XmlFormatting::Newline );
        xml.scopedElement( "system-err" ).writeText( trim( stdErrForSuite ), XmlFormatting::Newline );
    }